

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parse_example_json.h
# Opt level: O0

int read_features_json<true>(vw *all,v_array<example_*> *examples)

{
  bool bVar1;
  size_t num_chars_initial;
  size_t num_chars;
  char *line;
  bool reread;
  v_array<example_*> *in_stack_00000060;
  size_t in_stack_00000068;
  char *in_stack_00000070;
  vw *in_stack_00000078;
  size_t *in_stack_ffffffffffffffc8;
  char **in_stack_ffffffffffffffd0;
  vw *in_stack_ffffffffffffffd8;
  undefined4 in_stack_fffffffffffffff8;
  undefined4 in_stack_fffffffffffffffc;
  
  do {
    in_stack_ffffffffffffffc8 =
         (size_t *)
         read_features(in_stack_ffffffffffffffd8,in_stack_ffffffffffffffd0,in_stack_ffffffffffffffc8
                      );
    if (in_stack_ffffffffffffffc8 == (size_t *)0x0) {
      return 0;
    }
    *(undefined1 *)((long)&in_stack_ffffffffffffffd8->sd + (long)in_stack_ffffffffffffffd0) = 0;
    bVar1 = parse_line_json<true>
                      (in_stack_00000078,in_stack_00000070,in_stack_00000068,in_stack_00000060);
  } while (((bVar1 ^ 0xffU) & 1) != 0);
  prepare_for_learner((vw *)num_chars_initial,
                      (v_array<example_*> *)
                      CONCAT44(in_stack_fffffffffffffffc,in_stack_fffffffffffffff8));
  return 1;
}

Assistant:

int read_features_json(vw* all, v_array<example*>& examples)
{
  // Keep reading lines until a valid set of examples is produced.
  bool reread;
  do
  {
    reread = false;

    char* line;
    size_t num_chars;
    size_t num_chars_initial = read_features(all, line, num_chars);
    if (num_chars_initial < 1)
      return (int)num_chars_initial;

    // Ensure there is a null terminator.
    line[num_chars] = '\0';

    reread = !parse_line_json<audit>(all, line, num_chars, examples);
  } while (reread);

  prepare_for_learner(all, examples);

  return 1;
}